

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_encode.c
# Opt level: O0

void yajl_string_decode(yajl_buf buf,uchar *str,size_t len)

{
  ulong in_RDX;
  long lVar1;
  long in_RSI;
  void *in_RDI;
  uint surrogate;
  uint codepoint;
  char *unescaped;
  char utf8Buf [5];
  size_t end;
  size_t beg;
  void *in_stack_ffffffffffffffa8;
  yajl_buf in_stack_ffffffffffffffb0;
  uint local_40;
  uint local_3c;
  yajl_buf local_38;
  undefined1 local_2d [37];
  void *local_8;
  
  local_2d._13_8_ = 0;
  local_2d._5_8_ = 0;
  local_2d._21_8_ = in_RDX;
  local_2d._29_8_ = in_RSI;
  local_8 = in_RDI;
LAB_001076d5:
  while( true ) {
    if ((ulong)local_2d._21_8_ <= (ulong)local_2d._5_8_) {
      yajl_buf_append(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x1079a0);
      return;
    }
    if (*(char *)(local_2d._29_8_ + local_2d._5_8_) == '\\') break;
    local_2d._5_8_ = local_2d._5_8_ + 1;
  }
  local_38 = (yajl_buf)0x10badc;
  yajl_buf_append(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x107727);
  lVar1 = local_2d._5_8_ + 1;
  switch(*(undefined1 *)(local_2d._29_8_ + 1 + local_2d._5_8_)) {
  case 0x22:
    local_38 = (yajl_buf)0x10bad1;
    local_2d._5_8_ = lVar1;
    break;
  default:
    local_2d._5_8_ = lVar1;
    break;
  case 0x2f:
    local_38 = (yajl_buf)0x10bace;
    local_2d._5_8_ = lVar1;
    break;
  case 0x5c:
    local_38 = (yajl_buf)0x10bacb;
    local_2d._5_8_ = lVar1;
    break;
  case 0x62:
    local_38 = (yajl_buf)0x10bae2;
    local_2d._5_8_ = lVar1;
    break;
  case 0x66:
    local_38 = (yajl_buf)0x10bae0;
    local_2d._5_8_ = lVar1;
    break;
  case 0x6e:
    local_38 = (yajl_buf)0x10b062;
    local_2d._5_8_ = lVar1;
    break;
  case 0x72:
    local_38 = (yajl_buf)0x10bade;
    local_2d._5_8_ = lVar1;
    break;
  case 0x74:
    local_38 = (yajl_buf)0x10bae4;
    local_2d._5_8_ = lVar1;
    break;
  case 0x75:
    local_3c = 0;
    local_2d._5_8_ = local_2d._5_8_ + 2;
    hexToDigit(&local_3c,(uchar *)(local_2d._29_8_ + local_2d._5_8_));
    lVar1 = local_2d._5_8_ + 3;
    if ((local_3c & 0xfc00) == 0xd800) {
      local_2d._5_8_ = local_2d._5_8_ + 4;
      if ((*(char *)(local_2d._29_8_ + local_2d._5_8_) != '\\') ||
         (*(char *)(local_2d._29_8_ + 1 + local_2d._5_8_) != 'u')) {
        local_38 = (yajl_buf)0x10badc;
        break;
      }
      local_40 = 0;
      hexToDigit(&local_40,(uchar *)(local_2d._29_8_ + local_2d._5_8_ + 2));
      local_3c = (local_3c & 0x3f) << 10 | ((local_3c >> 6 & 0xf) + 1) * 0x10000 | local_40 & 0x3ff;
      lVar1 = local_2d._5_8_ + 5;
    }
    local_2d._5_8_ = lVar1;
    Utf32toUtf8(local_3c,local_2d);
    local_38 = (yajl_buf)local_2d;
    if (local_3c != 0) break;
    yajl_buf_append(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x10790f);
    local_2d._5_8_ = local_2d._5_8_ + 1;
    local_2d._13_8_ = local_2d._5_8_;
    goto LAB_001076d5;
  }
  in_stack_ffffffffffffffa8 = local_8;
  in_stack_ffffffffffffffb0 = local_38;
  strlen((char *)local_38);
  yajl_buf_append(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x10795a);
  local_2d._5_8_ = local_2d._5_8_ + 1;
  local_2d._13_8_ = local_2d._5_8_;
  goto LAB_001076d5;
}

Assistant:

void yajl_string_decode(yajl_buf buf, const unsigned char * str,
                        size_t len)
{
    size_t beg = 0;
    size_t end = 0;    

    while (end < len) {
        if (str[end] == '\\') {
            char utf8Buf[5];
            const char * unescaped = "?";
            yajl_buf_append(buf, str + beg, end - beg);
            switch (str[++end]) {
                case 'r': unescaped = "\r"; break;
                case 'n': unescaped = "\n"; break;
                case '\\': unescaped = "\\"; break;
                case '/': unescaped = "/"; break;
                case '"': unescaped = "\""; break;
                case 'f': unescaped = "\f"; break;
                case 'b': unescaped = "\b"; break;
                case 't': unescaped = "\t"; break;
                case 'u': {
                    unsigned int codepoint = 0;
                    hexToDigit(&codepoint, str + ++end);
                    end+=3;
                    /* check if this is a surrogate */
                    if ((codepoint & 0xFC00) == 0xD800) {
                        end++;
                        if (str[end] == '\\' && str[end + 1] == 'u') {
                            unsigned int surrogate = 0;
                            hexToDigit(&surrogate, str + end + 2);
                            codepoint =
                                (((codepoint & 0x3F) << 10) | 
                                 ((((codepoint >> 6) & 0xF) + 1) << 16) | 
                                 (surrogate & 0x3FF));
                            end += 5;
                        } else {
                            unescaped = "?";
                            break;
                        }
                    }
                    
                    Utf32toUtf8(codepoint, utf8Buf);
                    unescaped = utf8Buf;

                    if (codepoint == 0) {
                        yajl_buf_append(buf, unescaped, 1);
                        beg = ++end;
                        continue;
                    }

                    break;
                }
                default:
                    assert("this should never happen" == NULL);
            }
            yajl_buf_append(buf, unescaped, (unsigned int)strlen(unescaped));
            beg = ++end;
        } else {
            end++;
        }
    }
    yajl_buf_append(buf, str + beg, end - beg);
}